

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O1

string * __thiscall
arc::to_string_abi_cxx11_(string *__return_storage_ptr__,arc *this,atom *a,int write)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  type tVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 *puVar7;
  int iVar8;
  variant_alternative_t<8UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar9;
  long *plVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  byte *pbVar13;
  variant_alternative_t<3UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar14;
  variant_alternative_t<6UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar15;
  size_t sVar16;
  variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar17;
  long *plVar18;
  variant_alternative_t<9UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar19;
  variant_alternative_t<1UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar20;
  int write_00;
  _Array_type *p_Var21;
  long *plVar22;
  ulong *puVar23;
  arc *paVar24;
  size_type *psVar25;
  char *pcVar26;
  _Array_type *p_Var27;
  undefined8 uVar28;
  atom *this_00;
  _Hash_node_base *p_Var29;
  bool bVar30;
  stringstream ss;
  undefined1 local_420 [8];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_418;
  anon_class_1_0_00000001 local_3f9;
  string local_3f8;
  string local_3d8;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  string local_398;
  undefined4 local_378 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_370;
  undefined4 local_358 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_350;
  undefined1 local_338 [8];
  undefined1 local_330 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [7];
  ios_base local_2b8 [264];
  type local_1b0 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_1a8;
  type local_190 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_188;
  type local_170 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_168;
  type local_150 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_148;
  type local_130 [2];
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  local_128;
  atom local_110;
  atom local_f0;
  atom local_d0;
  atom local_b0;
  atom local_90;
  atom local_70;
  atom local_50;
  
  iVar8 = (int)a;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tVar4 = *(type *)this;
  if (0xd < (ulong)tVar4) {
    pcVar26 = "#<unknown type>";
    goto LAB_0011bca2;
  }
  p_Var21 = (_Array_type *)
            ((long)&switchD_0011b4b5::switchdataD_0012e08c +
            (long)(int)(&switchD_0011b4b5::switchdataD_0012e08c)[tVar4]);
  write_00 = (int)p_Var21;
  switch(tVar4) {
  case T_NIL:
    pcVar26 = "nil";
    break;
  case T_CONS:
    paVar24 = this + 8;
    local_f0.type = tVar4;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_f0.val,
                      (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)paVar24);
    iVar8 = listp(&local_f0);
    if (iVar8 == 0) {
      bVar30 = false;
    }
    else {
      local_110.type = *(type *)this;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_110.val,
                        (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)paVar24);
      sVar16 = len(&local_110);
      bVar30 = sVar16 == 2;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
        ::_S_vtable._M_arr
        [local_110.val.
         super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)local_338,&local_110.val);
      local_110.val.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_index = 0xff;
    }
    iVar8 = 0x13d9a0;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_f0.val.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)((anon_class_1_0_00000001 *)local_338,&local_f0.val);
    local_f0.val.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_index = 0xff;
    if (bVar30) {
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      bVar30 = is(&((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   car,(atom *)sym_quote);
      if (bVar30) {
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              *)paVar24);
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&(((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cdr).val);
        peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_50.type = (peVar6->car).type;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_50.val,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&(peVar6->car).val);
        to_string_abi_cxx11_
                  ((string *)local_420,(arc *)&local_50,(atom *)((ulong)a & 0xffffffff),iVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,"\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_420);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
        if (local_338 !=
            (undefined1  [8])
            ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)local_330)->
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    ).
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8U)) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        if (local_420 !=
            (undefined1  [8])
            ((long)&local_418.
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8)) {
          operator_delete((void *)local_420,
                          local_418.
                          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          ._M_u._8_8_ + 1);
        }
        this_00 = &local_50;
LAB_0011c441:
        atom::~atom(this_00);
        return __return_storage_ptr__;
      }
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      bVar30 = is(&((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   car,(atom *)sym_quasiquote);
      if (bVar30) {
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              *)paVar24);
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&(((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cdr).val);
        peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_70.type = (peVar6->car).type;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_70.val,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&(peVar6->car).val);
        to_string_abi_cxx11_
                  ((string *)local_420,(arc *)&local_70,(atom *)((ulong)a & 0xffffffff),iVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,"`",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_420);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
        if (local_338 !=
            (undefined1  [8])
            ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)local_330)->
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    ).
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8U)) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        if (local_420 !=
            (undefined1  [8])
            ((long)&local_418.
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8)) {
          operator_delete((void *)local_420,
                          local_418.
                          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          ._M_u._8_8_ + 1);
        }
        this_00 = &local_70;
        goto LAB_0011c441;
      }
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      bVar30 = is(&((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   car,(atom *)sym_unquote);
      if (bVar30) {
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              *)paVar24);
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&(((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cdr).val);
        peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_90.type = (peVar6->car).type;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_90.val,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&(peVar6->car).val);
        to_string_abi_cxx11_
                  ((string *)local_420,(arc *)&local_90,(atom *)((ulong)a & 0xffffffff),iVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,",",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_420);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
        if (local_338 !=
            (undefined1  [8])
            ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)local_330)->
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    ).
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8U)) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        if (local_420 !=
            (undefined1  [8])
            ((long)&local_418.
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8)) {
          operator_delete((void *)local_420,
                          local_418.
                          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          ._M_u._8_8_ + 1);
        }
        this_00 = &local_90;
        goto LAB_0011c441;
      }
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      bVar30 = is(&((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   car,(atom *)sym_unquote_splicing);
      if (bVar30) {
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              *)paVar24);
        pvVar20 = std::
                  get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&(((pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->cdr).val);
        peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_b0.type = (peVar6->car).type;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_b0.val,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&(peVar6->car).val);
        to_string_abi_cxx11_
                  ((string *)local_420,(arc *)&local_b0,(atom *)((ulong)a & 0xffffffff),iVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,",@",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_420);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
        if (local_338 !=
            (undefined1  [8])
            ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)local_330)->
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    ).
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8U)) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        if (local_420 !=
            (undefined1  [8])
            ((long)&local_418.
                    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    .
                    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                    ._M_u + 8)) {
          operator_delete((void *)local_420,
                          local_418.
                          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          ._M_u._8_8_ + 1);
        }
        this_00 = &local_b0;
        goto LAB_0011c441;
      }
    }
    pvVar20 = std::
              get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)paVar24);
    peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_130[0] = (peVar6->car).type;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_128,
                      (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&(peVar6->car).val);
    to_string_abi_cxx11_((string *)local_420,(arc *)local_130,(atom *)((ulong)a & 0xffffffff),iVar8)
    ;
    plVar18 = (long *)std::__cxx11::string::replace((ulong)local_420,0,(char *)0x0,0x12e346);
    puVar7 = (undefined1 *)
             ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                        *)local_330)->
                     super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     ).
                     super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     ._M_u + 8);
    psVar25 = (size_type *)(plVar18 + 2);
    if ((size_type *)*plVar18 == psVar25) {
      local_328[0]._0_8_ = *psVar25;
      local_328[0]._8_8_ = plVar18[3];
      local_338 = (undefined1  [8])puVar7;
    }
    else {
      local_328[0]._0_8_ = *psVar25;
      local_338 = (undefined1  [8])*plVar18;
    }
    local_330 = (undefined1  [8])plVar18[1];
    *plVar18 = (long)psVar25;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
    if (local_338 != (undefined1  [8])puVar7) {
      operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
    }
    if (local_420 !=
        (undefined1  [8])
        ((long)&local_418.
                super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                ._M_u + 8)) {
      operator_delete((void *)local_420,
                      local_418.
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._M_u._8_8_ + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_128.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_3f8,&local_128);
    local_128.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_index = 0xff;
    pvVar20 = std::
              get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)paVar24);
    peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(type *)this = (peVar6->cdr).type;
    p_Var27 = &std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
               ::_S_vtable;
    local_338 = (undefined1  [8])paVar24;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [(peVar6->cdr).val.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)((anon_class_8_1_8991fb9c_conflict *)local_338,&(peVar6->cdr).val);
    while( true ) {
      iVar8 = (int)p_Var27;
      tVar4 = *(type *)this;
      if (tVar4 != T_CONS) break;
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1b0[0] = (peVar6->car).type;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_1a8,
                        (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&(peVar6->car).val);
      to_string_abi_cxx11_
                ((string *)local_420,(arc *)local_1b0,(atom *)((ulong)a & 0xffffffff),iVar8);
      plVar18 = (long *)std::__cxx11::string::replace((ulong)local_420,0,(char *)0x0,0x135cb9);
      psVar25 = (size_type *)(plVar18 + 2);
      if ((size_type *)*plVar18 == psVar25) {
        local_328[0]._0_8_ = *psVar25;
        local_328[0]._8_8_ = plVar18[3];
        local_338 = (undefined1  [8])puVar7;
      }
      else {
        local_328[0]._0_8_ = *psVar25;
        local_338 = (undefined1  [8])*plVar18;
      }
      local_330 = (undefined1  [8])plVar18[1];
      *plVar18 = (long)psVar25;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_338);
      if (local_338 != (undefined1  [8])puVar7) {
        operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
      }
      if (local_420 !=
          (undefined1  [8])
          ((long)&local_418.
                  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  ._M_u + 8)) {
        operator_delete((void *)local_420,
                        local_418.
                        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        ._M_u._8_8_ + 1);
      }
      p_Var21 = &std::__detail::__variant::
                 __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
                 ::_S_vtable;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
        ::_S_vtable._M_arr
        [local_1a8.
         super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_3f8,&local_1a8);
      local_1a8.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_index = 0xff;
      pvVar20 = std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)paVar24);
      peVar6 = (pvVar20->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      *(type *)this = (peVar6->cdr).type;
      local_338 = (undefined1  [8])paVar24;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
        ::_S_vtable._M_arr
        [(peVar6->cdr).val.
         super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         .
         super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
         ._M_index]._M_data)((anon_class_8_1_8991fb9c_conflict *)local_338,&(peVar6->cdr).val);
      p_Var27 = (_Array_type *)p_Var21;
    }
    if (tVar4 != T_NIL) {
      local_d0.type = tVar4;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_d0.val,
                        (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)paVar24);
      to_string_abi_cxx11_
                ((string *)local_420,(arc *)&local_d0,(atom *)((ulong)a & 0xffffffff),iVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                     " . ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_420);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_338);
      if (local_338 != (undefined1  [8])puVar7) {
        operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
      }
      if (local_420 !=
          (undefined1  [8])
          ((long)&local_418.
                  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  ._M_u + 8)) {
        operator_delete((void *)local_420,
                        local_418.
                        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        ._M_u._8_8_ + 1);
      }
      atom::~atom(&local_d0);
    }
    goto LAB_0011c796;
  case T_SYM:
    std::
    get<2ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
              ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                *)(this + 8));
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case T_NUM:
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    *(undefined8 *)
     (&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
          *)local_330)->
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       ).
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index + *(long *)(local_328[0]._M_allocated_capacity - 0x18)) = 0x10;
    pvVar14 = std::
              get<3ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    std::ostream::_M_insert<double>(*pvVar14);
    std::__cxx11::stringbuf::str();
    goto LAB_0011b9d4;
  case T_BUILTIN:
    std::__cxx11::stringstream::stringstream((stringstream *)local_338);
    poVar12 = (ostream *)
              ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)local_330)->
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      ).
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._M_u + 8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"#<builtin:",10);
    std::
    get<4ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
              ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                *)(this + 8));
    poVar12 = std::ostream::_M_insert<void_const*>(poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,">",1);
    std::__cxx11::stringbuf::str();
LAB_0011b9d4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_420);
    if (local_420 !=
        (undefined1  [8])
        ((long)&local_418.
                super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                ._M_u + 8)) {
      operator_delete((void *)local_420,
                      local_418.
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._M_u._8_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
    std::ios_base::~ios_base(local_2b8);
    return __return_storage_ptr__;
  case T_CLOSURE:
    pvVar17 = std::
              get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    peVar5 = (pvVar17->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pvVar17 = std::
              get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    make_cons((atom *)local_420,&peVar5->args,
              &((pvVar17->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               body);
    make_cons((atom *)local_338,(atom *)&sym_fn,(atom *)local_420);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_418.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._16_8_ & 0xff]._M_data)((anon_class_1_0_00000001 *)&local_3f8,&local_418);
    local_150[0] = local_338._0_4_;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_148,
                      (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)local_330);
    to_string_abi_cxx11_(&local_3f8,(arc *)local_150,(atom *)0x1,write_00);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,0x12e309);
    pcVar2 = (pointer)((long)&local_418.
                              super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                              .
                              super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                              .
                              super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                              .
                              super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                              .
                              super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                              .
                              super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                              ._M_u + 8);
    psVar25 = (size_type *)(plVar18 + 2);
    if ((size_type *)*plVar18 == psVar25) {
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_u._8_8_ = *psVar25;
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._16_8_ = plVar18[3];
      local_420 = (undefined1  [8])pcVar2;
    }
    else {
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_u._8_8_ = *psVar25;
      local_420 = (undefined1  [8])*plVar18;
    }
    local_418.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_u._0_8_ = plVar18[1];
    *plVar18 = (long)psVar25;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_420);
    if (local_420 != (undefined1  [8])pcVar2) {
      operator_delete((void *)local_420,
                      local_418.
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._M_u._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_148.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_3b8,&local_148);
    local_148.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr[local_328[0]._8_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)local_420,
               (variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                *)local_330);
    return __return_storage_ptr__;
  case T_MACRO:
    pvVar17 = std::
              get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    peVar5 = (pvVar17->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_170[0] = (peVar5->args).type;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_168,
                      (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&(peVar5->args).val);
    to_string_abi_cxx11_(&local_398,(arc *)local_170,(atom *)((ulong)a & 0xffffffff),write_00);
    plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,0x12e314);
    plVar10 = plVar18 + 2;
    if ((long *)*plVar18 == plVar10) {
      local_3a8 = *plVar10;
      lStack_3a0 = plVar18[3];
      local_3b8 = &local_3a8;
    }
    else {
      local_3a8 = *plVar10;
      local_3b8 = (long *)*plVar18;
    }
    local_3b0 = plVar18[1];
    *plVar18 = (long)plVar10;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    plVar18 = (long *)std::__cxx11::string::append((char *)&local_3b8);
    paVar1 = &local_3f8.field_2;
    puVar23 = (ulong *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar23) {
      local_3f8.field_2._M_allocated_capacity = *puVar23;
      local_3f8.field_2._8_8_ = plVar18[3];
      local_3f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *puVar23;
      local_3f8._M_dataplus._M_p = (pointer)*plVar18;
    }
    local_3f8._M_string_length = plVar18[1];
    *plVar18 = (long)puVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    pvVar17 = std::
              get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    iVar8 = (int)puVar23;
    peVar5 = (pvVar17->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_190[0] = (peVar5->body).type;
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_188,
                      (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&(peVar5->body).val);
    to_string_abi_cxx11_(&local_3d8,(arc *)local_190,(atom *)((ulong)a & 0xffffffff),iVar8);
    uVar28 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      uVar28 = local_3f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar28 < local_3d8._M_string_length + local_3f8._M_string_length) {
      uVar28 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        uVar28 = local_3d8.field_2._M_allocated_capacity;
      }
      if (local_3d8._M_string_length + local_3f8._M_string_length <= (ulong)uVar28) {
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_3d8,0,(char *)0x0,(ulong)local_3f8._M_dataplus._M_p);
        goto LAB_0011c0b4;
      }
    }
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_3d8._M_dataplus._M_p);
LAB_0011c0b4:
    local_420 = (undefined1  [8])
                ((long)&local_418.
                        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        .
                        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                        ._M_u + 8);
    psVar25 = puVar11 + 2;
    if ((size_type *)*puVar11 == psVar25) {
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_u._8_8_ = *psVar25;
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._16_8_ = puVar11[3];
    }
    else {
      local_418.
      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      .
      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
      ._M_u._8_8_ = *psVar25;
      local_420 = (undefined1  [8])*puVar11;
    }
    local_418.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_u._0_8_ = puVar11[1];
    *puVar11 = psVar25;
    puVar11[1] = 0;
    *(undefined1 *)psVar25 = 0;
    plVar18 = (long *)std::__cxx11::string::append(local_420);
    puVar7 = (undefined1 *)
             ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                        *)local_330)->
                     super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     ).
                     super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     .
                     super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                     ._M_u + 8);
    psVar25 = (size_type *)(plVar18 + 2);
    if ((size_type *)*plVar18 == psVar25) {
      local_328[0]._0_8_ = *psVar25;
      local_328[0]._8_8_ = plVar18[3];
      local_338 = (undefined1  [8])puVar7;
    }
    else {
      local_328[0]._0_8_ = *psVar25;
      local_338 = (undefined1  [8])*plVar18;
    }
    local_330 = (undefined1  [8])plVar18[1];
    *plVar18 = (long)psVar25;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_338);
    if (local_338 != (undefined1  [8])puVar7) {
      operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
    }
    if (local_420 !=
        (undefined1  [8])
        ((long)&local_418.
                super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                .
                super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                ._M_u + 8)) {
      operator_delete((void *)local_420,
                      local_418.
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._M_u._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_188.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)(&local_3f9,&local_188);
    local_188.
    super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    .
    super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
    ._M_index = 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
      ::_S_vtable._M_arr
      [local_168.
       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
       ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_3d8,&local_168);
    return __return_storage_ptr__;
  case T_STRING:
    if (iVar8 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pvVar15 = std::
              get<6ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)(this + 8));
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)(((pvVar15->
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->_M_dataplus)._M_p);
    if (iVar8 == 0) {
      return __return_storage_ptr__;
    }
    goto LAB_0011c796;
  case T_INPUT:
    pcVar26 = "#<input>";
    break;
  case T_INPUT_PIPE:
    pcVar26 = "#<input-pipe>";
    break;
  case T_OUTPUT:
    pcVar26 = "#<output>";
    break;
  case T_TABLE:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar9 = std::
             get<8ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)(this + 8));
    p_Var29 = (((pvVar9->
                super___shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->_M_h)._M_before_begin._M_nxt;
    if (p_Var29 != (_Hash_node_base *)0x0) {
      paVar1 = &local_3f8.field_2;
      plVar18 = (long *)((long)&local_418.
                                super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                .
                                super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                .
                                super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                .
                                super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                .
                                super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                .
                                super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                ._M_u + 8);
      puVar7 = (undefined1 *)
               ((long)&(((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          *)local_330)->
                       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       ).
                       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       .
                       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                       ._M_u + 8);
      do {
        iVar8 = (int)p_Var21;
        local_358[0] = *(undefined4 *)&p_Var29[1]._M_nxt;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_350,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)(p_Var29 + 2));
        to_string_abi_cxx11_(&local_398,(arc *)local_358,(atom *)((ulong)a & 0xffffffff),iVar8);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,0x12e346);
        local_3b8 = &local_3a8;
        plVar22 = plVar10 + 2;
        if ((long *)*plVar10 == plVar22) {
          local_3a8 = *plVar22;
          lStack_3a0 = plVar10[3];
        }
        else {
          local_3a8 = *plVar22;
          local_3b8 = (long *)*plVar10;
        }
        local_3b0 = plVar10[1];
        *plVar10 = (long)plVar22;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_3b8);
        puVar23 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_3f8.field_2._M_allocated_capacity = *puVar23;
          local_3f8.field_2._8_8_ = plVar10[3];
          local_3f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_3f8.field_2._M_allocated_capacity = *puVar23;
          local_3f8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_3f8._M_string_length = plVar10[1];
        *plVar10 = (long)puVar23;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_378[0] = *(undefined4 *)&p_Var29[5]._M_nxt;
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_370,
                          (_Copy_ctor_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)(p_Var29 + 6));
        to_string_abi_cxx11_
                  (&local_3d8,(arc *)local_378,(atom *)((ulong)a & 0xffffffff),(int)puVar23);
        uVar28 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          uVar28 = local_3f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar28 < local_3d8._M_string_length + local_3f8._M_string_length) {
          uVar28 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            uVar28 = local_3d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 < local_3d8._M_string_length + local_3f8._M_string_length)
          goto LAB_0011b68d;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_3d8,0,(char *)0x0,(ulong)local_3f8._M_dataplus._M_p);
        }
        else {
LAB_0011b68d:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_3f8,(ulong)local_3d8._M_dataplus._M_p);
        }
        psVar25 = puVar11 + 2;
        if ((size_type *)*puVar11 == psVar25) {
          local_418.
          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          ._M_u._8_8_ = *psVar25;
          local_418.
          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          ._16_8_ = puVar11[3];
          local_420 = (undefined1  [8])plVar18;
        }
        else {
          local_418.
          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          .
          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          ._M_u._8_8_ = *psVar25;
          local_420 = (undefined1  [8])*puVar11;
        }
        local_418.
        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        ._M_u._0_8_ = puVar11[1];
        *puVar11 = psVar25;
        puVar11[1] = 0;
        *(undefined1 *)psVar25 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_420);
        paVar24 = (arc *)(puVar11 + 2);
        if ((arc *)*puVar11 == paVar24) {
          local_328[0]._0_8_ = *(undefined8 *)paVar24;
          local_328[0]._8_8_ = puVar11[3];
          local_338 = (undefined1  [8])puVar7;
        }
        else {
          local_328[0]._0_8_ = *(undefined8 *)paVar24;
          local_338 = (undefined1  [8])*puVar11;
        }
        local_330 = (undefined1  [8])puVar11[1];
        *puVar11 = paVar24;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_338);
        if (local_338 != (undefined1  [8])puVar7) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        if (local_420 != (undefined1  [8])plVar18) {
          operator_delete((void *)local_420,
                          local_418.
                          super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          .
                          super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                          ._M_u._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
          ::_S_vtable._M_arr
          [local_370.
           super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           ._M_index]._M_data)(&local_3f9,&local_370);
        local_370.
        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        ._M_index = 0xff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8,local_3a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        p_Var21 = &std::__detail::__variant::
                   __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
                   ::_S_vtable;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
          ::_S_vtable._M_arr
          [local_350.
           super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_3d8,&local_350);
        local_350.
        super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        .
        super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
        ._M_index = 0xff;
        p_Var29 = p_Var29->_M_nxt;
      } while (p_Var29 != (_Hash_node_base *)0x0);
    }
    goto LAB_0011c796;
  case T_CHAR:
    if (iVar8 == 0) {
      pvVar19 = std::
                get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            *)(this + 8));
      *(__return_storage_ptr__->_M_dataplus)._M_p = *pvVar19;
      (__return_storage_ptr__->_M_dataplus)._M_p[1] = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pbVar13 = (byte *)std::
                      get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                                ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                  *)(this + 8));
    bVar3 = *pbVar13;
    if (bVar3 < 10) {
      if ((bVar3 != 0) && (bVar3 != 9)) goto LAB_0011c354;
    }
    else if ((bVar3 != 10) && ((bVar3 != 0x20 && (bVar3 != 0xd)))) {
LAB_0011c354:
      std::
      get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                  *)(this + 8));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
LAB_0011c796:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case T_CONTINUATION:
    pcVar26 = "#<continuation>";
  }
LAB_0011bca2:
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar26);
  return __return_storage_ptr__;
}

Assistant:

string to_string(atom a, int write) {
		string s;
		switch (a.type) {
		case T_NIL:
			s = "nil";
			break;
		case T_CONS: {
			if (listp(a) && len(a) == 2) {
				if (is(car(a), sym_quote)) {
					s = "'" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_quasiquote)) {
					s = "`" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote)) {
					s = "," + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote_splicing)) {
					s = ",@" + to_string(car(cdr(a)), write);
					break;
				}
			}
			s = "(" + to_string(car(a), write);
			a = cdr(a);
			while (!no(a)) {
				if (a.type == T_CONS) {
					s += " " + to_string(car(a), write);
					a = cdr(a);
				}
				else {
					s += " . " + to_string(a, write);
					break;
				}
			}
			s += ")";
			break;
		}
		case T_SYM:
			s = *get<sym>(a.val);
			break;
		case T_STRING:
			if (write) s += "\"";
			s += a.asp<string>();
			if (write) s += "\"";
			break;
		case T_NUM:
		{
			stringstream ss;
			ss << setprecision(16) << get<double>(a.val);
			s = ss.str();
			break;
		}
		case T_BUILTIN:
		{
			stringstream ss;
			ss << "#<builtin:" << (void*)get<builtin>(a.val) << ">";
			s = ss.str();
			break;
		}
		case T_CLOSURE:
		{
			atom a2 = make_cons(sym_fn, make_cons(a.asp<struct closure>().args, a.asp<struct closure>().body));
			s = "#<closure>" + to_string(a2, 1);
			break;
		}
		case T_MACRO:
			s = "#<macro:" + to_string(a.asp<struct closure>().args, write) +
				" " + to_string(a.asp<struct closure>().body, write) + ">";
			break;
		case T_INPUT:
			s = "#<input>";
			break;
		case T_INPUT_PIPE:
			s = "#<input-pipe>";
			break;
		case T_OUTPUT:
			s = "#<output>";
			break;
		case T_TABLE: {
			s += "#<table:(";
			for (auto& p : a.asp<table>()) {
				s += "(" + to_string(p.first, write) + " . " + to_string(p.second, write) + ")";
			}
			s += ")>";
			break; }
		case T_CHAR:
			if (write) {
				s += "#\\";
				switch (get<char>(a.val)) {
				case '\0': s += "nul"; break;
				case '\r': s += "return"; break;
				case '\n': s += "newline"; break;
				case '\t': s += "tab"; break;
				case ' ': s += "space"; break;
				default:
					s += get<char>(a.val);
				}
			}
			else {
				s[0] = get<char>(a.val);
				s[1] = '\0';
			}
			break;
		case T_CONTINUATION:
			s = "#<continuation>";
			break;
		default:
			s = "#<unknown type>";
			break;
		}
		return s;
	}